

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O0

int main(int argc,char **argv)

{
  __uid_t _Var1;
  int iVar2;
  wchar_t wVar3;
  char *pcVar4;
  archive *paVar5;
  int *piVar6;
  long lVar7;
  _union_1457 local_210;
  sigaction sa;
  int t;
  int opt;
  char *tptr;
  char *errmsg;
  cpio_owner owner;
  cpio *cpio;
  cpio _cpio;
  char **argv_local;
  int argc_local;
  
  owner.gname = (char *)&cpio;
  _cpio.ppbuff = (char *)argv;
  memset(owner.gname,0,0x128);
  *(char **)(owner.gname + 0x110) = main::buff;
  pcVar4 = owner.gname;
  pcVar4[0x118] = '\0';
  pcVar4[0x119] = '@';
  pcVar4[0x11a] = '\0';
  pcVar4[0x11b] = '\0';
  pcVar4[0x11c] = '\0';
  pcVar4[0x11d] = '\0';
  pcVar4[0x11e] = '\0';
  pcVar4[0x11f] = '\0';
  sigemptyset((sigset_t *)&sa);
  sa.sa_mask.__val[0xf]._0_4_ = 0;
  local_210 = (_union_1457)0x1;
  sigaction(0xd,(sigaction *)&local_210,(sigaction *)0x0);
  lafe_setprogname(*(char **)_cpio.ppbuff,"bsdcpio");
  pcVar4 = setlocale(6,"");
  if (pcVar4 == (char *)0x0) {
    lafe_warnc(0,"Failed to set default locale");
  }
  owner.gname[0x90] = -1;
  owner.gname[0x91] = -1;
  owner.gname[0x92] = -1;
  owner.gname[0x93] = -1;
  owner.gname[0x98] = '\0';
  owner.gname[0x99] = '\0';
  owner.gname[0x9a] = '\0';
  owner.gname[0x9b] = '\0';
  owner.gname[0x9c] = '\0';
  owner.gname[0x9d] = '\0';
  owner.gname[0x9e] = '\0';
  owner.gname[0x9f] = '\0';
  owner.gname[0xa0] = -1;
  owner.gname[0xa1] = -1;
  owner.gname[0xa2] = -1;
  owner.gname[0xa3] = -1;
  owner.gname[0xa8] = '\0';
  owner.gname[0xa9] = '\0';
  owner.gname[0xaa] = '\0';
  owner.gname[0xab] = '\0';
  owner.gname[0xac] = '\0';
  owner.gname[0xad] = '\0';
  owner.gname[0xae] = '\0';
  owner.gname[0xaf] = '\0';
  *(char **)(owner.gname + 0xe0) = _cpio.ppbuff;
  *(int *)(owner.gname + 0xd8) = argc;
  owner.gname[0x18] = '\0';
  owner.gname[0x19] = '\0';
  owner.gname[0x1a] = '\0';
  owner.gname[0x1b] = '\0';
  owner.gname[0x2c] = '\0';
  owner.gname[0x2d] = '\0';
  owner.gname[0x2e] = '\0';
  owner.gname[0x2f] = '\0';
  owner.gname[0x1c] = '\0';
  owner.gname[0x1d] = '\0';
  owner.gname[0x1e] = '\0';
  owner.gname[0x1f] = '\0';
  owner.gname[0x38] = '\0';
  owner.gname[0x39] = '\x04';
  owner.gname[0x3a] = '\0';
  owner.gname[0x3b] = '\0';
  *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) | 0x800;
  *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) | 0x100;
  *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) | 0x200;
  *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) | 0x10000;
  *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) | 2;
  *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) | 0x40;
  *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) | 0x20;
  _Var1 = geteuid();
  if (_Var1 == 0) {
    *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) | 1;
  }
  owner.gname[0x28] = '\0';
  owner.gname[0x29] = '\x02';
  owner.gname[0x2a] = '\0';
  owner.gname[0x2b] = '\0';
  owner.gname[0x10] = '\0';
  owner.gname[0x11] = '\0';
  owner.gname[0x12] = '\0';
  owner.gname[0x13] = '\0';
  owner.gname[0x14] = '\0';
  owner.gname[0x15] = '\0';
  owner.gname[0x16] = '\0';
  owner.gname[0x17] = '\0';
  paVar5 = archive_match_new();
  *(archive **)(owner.gname + 0x108) = paVar5;
  if (*(long *)(owner.gname + 0x108) == 0) {
    lafe_errc(1,0,"Out of memory");
  }
  while (sa.sa_restorer._4_4_ = cpio_getopt((cpio *)owner.gname), sa.sa_restorer._4_4_ != -1) {
    switch(sa.sa_restorer._4_4_) {
    case 1:
      *(int *)(owner.gname + 8) = sa.sa_restorer._4_4_;
      break;
    case 2:
      *(int *)(owner.gname + 0x1c) = sa.sa_restorer._4_4_;
      break;
    case 3:
      *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) & 0xfffffeff;
      *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) & 0xfffffdff;
      *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) & 0xfffeffff;
      break;
    case 4:
    case 5:
    case 6:
    case 7:
    case 0xe:
      *(int *)(owner.gname + 0x1c) = sa.sa_restorer._4_4_;
      break;
    case 8:
      *(undefined8 *)(owner.gname + 0xb8) = *(undefined8 *)owner.gname;
      break;
    case 9:
      *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) & 0xfffffffe;
      break;
    case 10:
      *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) | 1;
      break;
    case 0xb:
      owner.gname[0x34] = '\x01';
      owner.gname[0x35] = '\0';
      owner.gname[0x36] = '\0';
      owner.gname[0x37] = '\0';
      break;
    case 0xc:
      *(int *)(owner.gname + 8) = sa.sa_restorer._4_4_;
      break;
    case 0xd:
      version();
    default:
      usage();
    case 0x30:
      owner.gname[0x5c] = '\x01';
      break;
    case 0x36:
      owner.gname[100] = '\x01';
      owner.gname[0x65] = '\0';
      owner.gname[0x66] = '\0';
      owner.gname[0x67] = '\0';
      break;
    case 0x37:
      *(char **)(owner.gname + 0x20) = "bin";
      break;
    case 0x41:
      owner.gname[0x48] = '\x01';
      owner.gname[0x49] = '\0';
      owner.gname[0x4a] = '\0';
      owner.gname[0x4b] = '\0';
      break;
    case 0x42:
      owner.gname[0x28] = '\0';
      owner.gname[0x29] = '\x14';
      owner.gname[0x2a] = '\0';
      owner.gname[0x2b] = '\0';
      break;
    case 0x43:
      piVar6 = __errno_location();
      *piVar6 = 0;
      _t = (char *)0x0;
      lVar7 = strtol(*(char **)owner.gname,(char **)&t,10);
      sa.sa_restorer._0_4_ = (int)lVar7;
      piVar6 = __errno_location();
      if ((((*piVar6 != 0) || ((int)sa.sa_restorer < 1)) || (**(char **)owner.gname == '\0')) ||
         ((_t == (char *)0x0 || (*_t != '\0')))) {
        lafe_errc(1,0,"Invalid blocksize: %s",*(undefined8 *)owner.gname);
      }
      *(int *)(owner.gname + 0x28) = (int)sa.sa_restorer;
      break;
    case 0x45:
      wVar3 = archive_match_include_pattern_from_file
                        (*(archive **)(owner.gname + 0x108),*(char **)owner.gname,
                         (int)owner.gname[0x5c]);
      if (wVar3 != L'\0') {
        pcVar4 = archive_error_string(*(archive **)(owner.gname + 0x108));
        lafe_errc(1,0,"Error : %s",pcVar4);
      }
      break;
    case 0x46:
      *(undefined8 *)(owner.gname + 0x10) = *(undefined8 *)owner.gname;
      break;
    case 0x48:
      *(undefined8 *)(owner.gname + 0x20) = *(undefined8 *)owner.gname;
      break;
    case 0x49:
      *(undefined8 *)(owner.gname + 0x10) = *(undefined8 *)owner.gname;
      break;
    case 0x4a:
      *(int *)(owner.gname + 0x1c) = sa.sa_restorer._4_4_;
      break;
    case 0x4c:
      owner.gname[0x50] = '\x01';
      owner.gname[0x51] = '\0';
      owner.gname[0x52] = '\0';
      owner.gname[0x53] = '\0';
      break;
    case 0x4f:
      *(undefined8 *)(owner.gname + 0x10) = *(undefined8 *)owner.gname;
      break;
    case 0x52:
      tptr = (char *)0x0;
      iVar2 = owner_parse(*(char **)owner.gname,(cpio_owner *)&errmsg,&tptr);
      if (iVar2 != 0) {
        if (tptr == (char *)0x0) {
          tptr = "Error parsing owner";
        }
        lafe_warnc(-1,"%s",tptr);
        usage();
      }
      if ((int)errmsg != -1) {
        *(int *)(owner.gname + 0x90) = (int)errmsg;
      }
      if (owner._0_8_ != 0) {
        *(undefined8 *)(owner.gname + 0x98) = owner._0_8_;
      }
      if (errmsg._4_4_ != -1) {
        *(int *)(owner.gname + 0xa0) = errmsg._4_4_;
      }
      if (owner.uname != (char *)0x0) {
        *(char **)(owner.gname + 0xa8) = owner.uname;
      }
      break;
    case 0x56:
      *(int *)(owner.gname + 0x30) = *(int *)(owner.gname + 0x30) + 1;
      break;
    case 0x5a:
      *(int *)(owner.gname + 0x1c) = sa.sa_restorer._4_4_;
      break;
    case 0x61:
      owner.gname[0x4c] = '\x01';
      owner.gname[0x4d] = '\0';
      owner.gname[0x4e] = '\0';
      owner.gname[0x4f] = '\0';
      break;
    case 99:
      *(char **)(owner.gname + 0x20) = "odc";
      break;
    case 100:
      *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) & 0xfffffbff;
      break;
    case 0x66:
      wVar3 = archive_match_exclude_pattern
                        (*(archive **)(owner.gname + 0x108),*(char **)owner.gname);
      if (wVar3 != L'\0') {
        pcVar4 = archive_error_string(*(archive **)(owner.gname + 0x108));
        lafe_errc(1,0,"Error : %s",pcVar4);
      }
      break;
    case 0x68:
      long_help();
    case 0x69:
      if (*(int *)(owner.gname + 0x18) != 0) {
        lafe_errc(1,0,"Cannot use both -i and -%c",(ulong)*(uint *)(owner.gname + 0x18));
      }
      *(int *)(owner.gname + 0x18) = sa.sa_restorer._4_4_;
      break;
    case 0x6a:
      *(int *)(owner.gname + 0x1c) = sa.sa_restorer._4_4_;
      break;
    case 0x6c:
      owner.gname[0x54] = '\x01';
      owner.gname[0x55] = '\0';
      owner.gname[0x56] = '\0';
      owner.gname[0x57] = '\0';
      break;
    case 0x6d:
      *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) | 4;
      break;
    case 0x6e:
      owner.gname[0x60] = '\x01';
      owner.gname[0x61] = '\0';
      owner.gname[0x62] = '\0';
      owner.gname[99] = '\0';
      break;
    case 0x6f:
      if (*(int *)(owner.gname + 0x18) != 0) {
        lafe_errc(1,0,"Cannot use both -o and -%c",(ulong)*(uint *)(owner.gname + 0x18));
      }
      *(int *)(owner.gname + 0x18) = sa.sa_restorer._4_4_;
      break;
    case 0x70:
      if (*(int *)(owner.gname + 0x18) != 0) {
        lafe_errc(1,0,"Cannot use both -p and -%c",(ulong)*(uint *)(owner.gname + 0x18));
      }
      *(int *)(owner.gname + 0x18) = sa.sa_restorer._4_4_;
      *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) & 0xfffffdff;
      *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) & 0xfffeffff;
      break;
    case 0x72:
      owner.gname[0x68] = '\x01';
      owner.gname[0x69] = '\0';
      owner.gname[0x6a] = '\0';
      owner.gname[0x6b] = '\0';
      break;
    case 0x74:
      owner.gname[0x58] = '\x01';
      owner.gname[0x59] = '\0';
      owner.gname[0x5a] = '\0';
      owner.gname[0x5b] = '\0';
      break;
    case 0x75:
      *(uint *)(owner.gname + 0x38) = *(uint *)(owner.gname + 0x38) & 0xfffff7ff;
      break;
    case 0x76:
      *(int *)(owner.gname + 0x2c) = *(int *)(owner.gname + 0x2c) + 1;
      break;
    case 0x79:
      *(int *)(owner.gname + 0x1c) = sa.sa_restorer._4_4_;
      break;
    case 0x7a:
      *(int *)(owner.gname + 0x1c) = sa.sa_restorer._4_4_;
    }
  }
  if ((*(int *)(owner.gname + 0x58) != 0) && (*(int *)(owner.gname + 0x18) == 0)) {
    owner.gname[0x18] = 'i';
    owner.gname[0x19] = '\0';
    owner.gname[0x1a] = '\0';
    owner.gname[0x1b] = '\0';
  }
  if ((*(int *)(owner.gname + 0x58) != 0) && (*(int *)(owner.gname + 0x18) != 0x69)) {
    lafe_errc(1,0,"Option -t requires -i");
  }
  if ((*(int *)(owner.gname + 0x60) != 0) && (*(int *)(owner.gname + 0x58) == 0)) {
    lafe_errc(1,0,"Option -n requires -it");
  }
  if ((*(long *)(owner.gname + 0x20) != 0) && (*(int *)(owner.gname + 0x18) != 0x6f)) {
    lafe_errc(1,0,"Option --format requires -o");
  }
  if ((*(int *)(owner.gname + 0x54) != 0) && (*(int *)(owner.gname + 0x18) != 0x70)) {
    lafe_errc(1,0,"Option -l requires -p");
  }
  if ((*(int *)(owner.gname + 0x30) != 0) && (*(int *)(owner.gname + 0x2c) != 0)) {
    owner.gname[0x30] = '\0';
    owner.gname[0x31] = '\0';
    owner.gname[0x32] = '\0';
    owner.gname[0x33] = '\0';
  }
  iVar2 = *(int *)(owner.gname + 0x18);
  if (iVar2 == 0x69) {
    sa.sa_restorer._4_4_ = 0xffffffff;
    while( true ) {
      if (**(long **)(owner.gname + 0xe0) == 0) {
        if (*(int *)(owner.gname + 0x58) != 0) {
          mode_list((cpio *)owner.gname);
        }
        mode_in((cpio *)owner.gname);
      }
      wVar3 = archive_match_include_pattern
                        (*(archive **)(owner.gname + 0x108),
                         (char *)**(undefined8 **)(owner.gname + 0xe0));
      if (wVar3 != L'\0') break;
      *(int *)(owner.gname + 0xd8) = *(int *)(owner.gname + 0xd8) + -1;
      *(long *)(owner.gname + 0xe0) = *(long *)(owner.gname + 0xe0) + 8;
    }
    pcVar4 = archive_error_string(*(archive **)(owner.gname + 0x108));
    lafe_errc(1,0,"Error : %s",pcVar4);
  }
  if (iVar2 == 0x6f) {
    if (*(long *)(owner.gname + 0x20) == 0) {
      if (*(int *)(owner.gname + 100) == 0) {
        *(char **)(owner.gname + 0x20) = "cpio";
      }
      else {
        *(char **)(owner.gname + 0x20) = "pwb";
      }
    }
    mode_out((cpio *)owner.gname);
  }
  else {
    if (iVar2 != 0x70) {
      lafe_errc(1,0,"Must specify at least one of -i, -o, or -p");
    }
    if ((**(long **)(owner.gname + 0xe0) == 0) ||
       (*(char *)**(undefined8 **)(owner.gname + 0xe0) == '\0')) {
      lafe_errc(1,0,"-p mode requires a target directory");
    }
    mode_pass((cpio *)owner.gname,(char *)**(undefined8 **)(owner.gname + 0xe0));
  }
  archive_match_free(*(archive **)(owner.gname + 0x108));
  free_cache(*(name_cache **)(owner.gname + 0xf8));
  free(*(void **)(owner.gname + 0x98));
  free_cache(*(name_cache **)(owner.gname + 0x100));
  free(*(void **)(owner.gname + 0xa8));
  archive_read_close(*(archive **)(owner.gname + 0xd0));
  archive_read_free(*(archive **)(owner.gname + 0xd0));
  free(*(void **)(owner.gname + 0x70));
  passphrase_free(*(char **)(owner.gname + 0x120));
  return *(int *)(owner.gname + 0xe8);
}

Assistant:

int
main(int argc, char *argv[])
{
	static char buff[16384];
	struct cpio _cpio; /* Allocated on stack. */
	struct cpio *cpio;
	struct cpio_owner owner;
	const char *errmsg;
	char *tptr;
	int opt, t;

	cpio = &_cpio;
	memset(cpio, 0, sizeof(*cpio));
	cpio->buff = buff;
	cpio->buff_size = sizeof(buff);


#if defined(HAVE_SIGACTION) && defined(SIGPIPE)
	{ /* Ignore SIGPIPE signals. */
		struct sigaction sa;
		sigemptyset(&sa.sa_mask);
		sa.sa_flags = 0;
		sa.sa_handler = SIG_IGN;
		sigaction(SIGPIPE, &sa, NULL);
	}
#endif

	/* Set lafe_progname before calling lafe_warnc. */
	lafe_setprogname(*argv, "bsdcpio");

#if HAVE_SETLOCALE
	if (setlocale(LC_ALL, "") == NULL)
		lafe_warnc(0, "Failed to set default locale");
#endif

	cpio->uid_override = -1;
	cpio->uname_override = NULL;
	cpio->gid_override = -1;
	cpio->gname_override = NULL;
	cpio->argv = argv;
	cpio->argc = argc;
	cpio->mode = '\0';
	cpio->verbose = 0;
	cpio->compress = '\0';
	cpio->extract_flags = ARCHIVE_EXTRACT_NO_AUTODIR;
	cpio->extract_flags |= ARCHIVE_EXTRACT_NO_OVERWRITE_NEWER;
	cpio->extract_flags |= ARCHIVE_EXTRACT_SECURE_SYMLINKS;
	cpio->extract_flags |= ARCHIVE_EXTRACT_SECURE_NODOTDOT;
	cpio->extract_flags |= ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS;
	cpio->extract_flags |= ARCHIVE_EXTRACT_PERM;
	cpio->extract_flags |= ARCHIVE_EXTRACT_FFLAGS;
	cpio->extract_flags |= ARCHIVE_EXTRACT_ACL;
#if !defined(_WIN32) && !defined(__CYGWIN__)
	if (geteuid() == 0)
		cpio->extract_flags |= ARCHIVE_EXTRACT_OWNER;
#endif
	cpio->bytes_per_block = 512;
	cpio->filename = NULL;

	cpio->matching = archive_match_new();
	if (cpio->matching == NULL)
		lafe_errc(1, 0, "Out of memory");

	while ((opt = cpio_getopt(cpio)) != -1) {
		switch (opt) {
		case '0': /* GNU convention: --null, -0 */
			cpio->option_null = 1;
			break;
		case '6': /* in/out: assume/create 6th edition (PWB) format */
			cpio->option_pwb = 1;
			break;
		case '7': /* out: create archive using 7th Edition binary format */
			cpio->format = "bin";
			break;
		case 'A': /* NetBSD/OpenBSD */
			cpio->option_append = 1;
			break;
		case 'a': /* POSIX 1997 */
			cpio->option_atime_restore = 1;
			break;
		case 'B': /* POSIX 1997 */
			cpio->bytes_per_block = 5120;
			break;
		case OPTION_B64ENCODE:
			cpio->add_filter = opt;
			break;
		case 'C': /* NetBSD/OpenBSD */
			errno = 0;
			tptr = NULL;
			t = (int)strtol(cpio->argument, &tptr, 10);
			if (errno || t <= 0 || *(cpio->argument) == '\0' ||
			    tptr == NULL || *tptr != '\0') {
				lafe_errc(1, 0, "Invalid blocksize: %s",
				    cpio->argument);
			}
			cpio->bytes_per_block = t;
			break;
		case 'c': /* POSIX 1997 */
			cpio->format = "odc";
			break;
		case 'd': /* POSIX 1997 */
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_NO_AUTODIR;
			break;
		case 'E': /* NetBSD/OpenBSD */
			if (archive_match_include_pattern_from_file(
			    cpio->matching, cpio->argument,
			    cpio->option_null) != ARCHIVE_OK)
				lafe_errc(1, 0, "Error : %s",
				    archive_error_string(cpio->matching));
			break;
		case 'F': /* NetBSD/OpenBSD/GNU cpio */
			cpio->filename = cpio->argument;
			break;
		case 'f': /* POSIX 1997 */
			if (archive_match_exclude_pattern(cpio->matching,
			    cpio->argument) != ARCHIVE_OK)
				lafe_errc(1, 0, "Error : %s",
				    archive_error_string(cpio->matching));
			break;
		case OPTION_GRZIP:
			cpio->compress = opt;
			break;
		case 'H': /* GNU cpio (also --format) */
			cpio->format = cpio->argument;
			break;
		case 'h':
			long_help();
			/* NOTREACHED */
		case 'I': /* NetBSD/OpenBSD */
			cpio->filename = cpio->argument;
			break;
		case 'i': /* POSIX 1997 */
			if (cpio->mode != '\0')
				lafe_errc(1, 0,
				    "Cannot use both -i and -%c", cpio->mode);
			cpio->mode = opt;
			break;
		case 'J': /* GNU tar, others */
			cpio->compress = opt;
			break;
		case 'j': /* GNU tar, others */
			cpio->compress = opt;
			break;
		case OPTION_INSECURE:
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_SECURE_SYMLINKS;
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_SECURE_NODOTDOT;
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS;
			break;
		case 'L': /* GNU cpio */
			cpio->option_follow_links = 1;
			break;
		case 'l': /* POSIX 1997 */
			cpio->option_link = 1;
			break;
		case OPTION_LRZIP:
		case OPTION_LZ4:
		case OPTION_LZMA: /* GNU tar, others */
		case OPTION_LZOP: /* GNU tar, others */
		case OPTION_ZSTD:
			cpio->compress = opt;
			break;
		case 'm': /* POSIX 1997 */
			cpio->extract_flags |= ARCHIVE_EXTRACT_TIME;
			break;
		case 'n': /* GNU cpio */
			cpio->option_numeric_uid_gid = 1;
			break;
		case OPTION_NO_PRESERVE_OWNER: /* GNU cpio */
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_OWNER;
			break;
		case 'O': /* GNU cpio */
			cpio->filename = cpio->argument;
			break;
		case 'o': /* POSIX 1997 */
			if (cpio->mode != '\0')
				lafe_errc(1, 0,
				    "Cannot use both -o and -%c", cpio->mode);
			cpio->mode = opt;
			break;
		case 'p': /* POSIX 1997 */
			if (cpio->mode != '\0')
				lafe_errc(1, 0,
				    "Cannot use both -p and -%c", cpio->mode);
			cpio->mode = opt;
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_SECURE_NODOTDOT;
			cpio->extract_flags &= ~ARCHIVE_EXTRACT_SECURE_NOABSOLUTEPATHS;
			break;
		case OPTION_PASSPHRASE:
			cpio->passphrase = cpio->argument;
			break;
		case OPTION_PRESERVE_OWNER:
			cpio->extract_flags |= ARCHIVE_EXTRACT_OWNER;
			break;
		case OPTION_QUIET: /* GNU cpio */
			cpio->quiet = 1;
			break;
		case 'R': /* GNU cpio, also --owner */
			errmsg = NULL;
			if (owner_parse(cpio->argument, &owner, &errmsg) != 0) {
				if (!errmsg)
					errmsg = "Error parsing owner";
				lafe_warnc(-1, "%s", errmsg);
				usage();
			}
			if (owner.uid != -1)
				cpio->uid_override = owner.uid;
			if (owner.uname != NULL)
				cpio->uname_override = owner.uname;
			if (owner.gid != -1)
				cpio->gid_override = owner.gid;
			if (owner.gname != NULL)
				cpio->gname_override = owner.gname;
			break;
		case 'r': /* POSIX 1997 */
			cpio->option_rename = 1;
			break;
		case 't': /* POSIX 1997 */
			cpio->option_list = 1;
			break;
		case 'u': /* POSIX 1997 */
			cpio->extract_flags
			    &= ~ARCHIVE_EXTRACT_NO_OVERWRITE_NEWER;
			break;
		case OPTION_UUENCODE:
			cpio->add_filter = opt;
			break;
		case 'v': /* POSIX 1997 */
			cpio->verbose++;
			break;
		case 'V': /* GNU cpio */
			cpio->dot++;
			break;
		case OPTION_VERSION: /* GNU convention */
			version();
			/* NOTREACHED */
#if 0
	        /*
		 * cpio_getopt() handles -W specially, so it's not
		 * available here.
		 */
		case 'W': /* Obscure, but useful GNU convention. */
			break;
#endif
		case 'y': /* tar convention */
			cpio->compress = opt;
			break;
		case 'Z': /* tar convention */
			cpio->compress = opt;
			break;
		case 'z': /* tar convention */
			cpio->compress = opt;
			break;
		default:
			usage();
		}
	}

	/*
	 * Sanity-check args, error out on nonsensical combinations.
	 */
	/* -t implies -i if no mode was specified. */
	if (cpio->option_list && cpio->mode == '\0')
		cpio->mode = 'i';
	/* -t requires -i */
	if (cpio->option_list && cpio->mode != 'i')
		lafe_errc(1, 0, "Option -t requires -i");
	/* -n requires -it */
	if (cpio->option_numeric_uid_gid && !cpio->option_list)
		lafe_errc(1, 0, "Option -n requires -it");
	/* Can only specify format when writing */
	if (cpio->format != NULL && cpio->mode != 'o')
		lafe_errc(1, 0, "Option --format requires -o");
	/* -l requires -p */
	if (cpio->option_link && cpio->mode != 'p')
		lafe_errc(1, 0, "Option -l requires -p");
	/* -v overrides -V */
	if (cpio->dot && cpio->verbose)
		cpio->dot = 0;
	/* TODO: Flag other nonsensical combinations. */

	switch (cpio->mode) {
	case 'o':
		if (cpio->format == NULL) {
			if (cpio->option_pwb)
				cpio->format = "pwb";
			else
				cpio->format = "cpio";
		}
		mode_out(cpio);
		break;
	case 'i':
		while (*cpio->argv != NULL) {
			if (archive_match_include_pattern(cpio->matching,
			    *cpio->argv) != ARCHIVE_OK)
				lafe_errc(1, 0, "Error : %s",
				    archive_error_string(cpio->matching));
			--cpio->argc;
			++cpio->argv;
		}
		if (cpio->option_list)
			mode_list(cpio);
		else
			mode_in(cpio);
		/* NOTREACHED */
	case 'p':
		if (*cpio->argv == NULL || **cpio->argv == '\0')
			lafe_errc(1, 0,
			    "-p mode requires a target directory");
		mode_pass(cpio, *cpio->argv);
		break;
	default:
		lafe_errc(1, 0,
		    "Must specify at least one of -i, -o, or -p");
	}

	archive_match_free(cpio->matching);
	free_cache(cpio->uname_cache);
	free(cpio->uname_override);
	free_cache(cpio->gname_cache);
	free(cpio->gname_override);
	archive_read_close(cpio->archive_read_disk);
	archive_read_free(cpio->archive_read_disk);
	free(cpio->destdir);

	passphrase_free(cpio->ppbuff);
	return (cpio->return_value);
}